

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outer_join_marker.cpp
# Opt level: O1

void __thiscall
duckdb::OuterJoinMarker::Scan
          (OuterJoinMarker *this,OuterJoinGlobalScanState *gstate,OuterJoinLocalScanState *lstate,
          DataChunk *result)

{
  long lVar1;
  idx_t iVar2;
  _Head_base<0UL,_bool_*,_false> _Var3;
  idx_t iVar4;
  sel_t *psVar5;
  bool bVar6;
  reference pvVar7;
  reference other;
  size_type sVar8;
  idx_t iVar9;
  ulong uVar10;
  idx_t count;
  
  bVar6 = ColumnDataCollection::Scan
                    (gstate->data,&gstate->global_scan,&lstate->local_scan,&lstate->scan_chunk);
  if (bVar6) {
    do {
      iVar2 = (lstate->scan_chunk).count;
      if (iVar2 == 0) {
        count = 0;
      }
      else {
        _Var3._M_head_impl =
             (this->found_match).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
             super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
             super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
             super__Head_base<0UL,_bool_*,_false>._M_head_impl;
        iVar4 = (lstate->local_scan).current_row_index;
        psVar5 = (lstate->match_sel).sel_vector;
        count = 0;
        iVar9 = 0;
        do {
          if (_Var3._M_head_impl[iVar9 + iVar4] == false) {
            psVar5[count] = (sel_t)iVar9;
            count = count + 1;
          }
          iVar9 = iVar9 + 1;
        } while (iVar2 != iVar9);
      }
      if (count != 0) {
        uVar10 = ((long)(lstate->scan_chunk).data.
                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(lstate->scan_chunk).data.
                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) * -0x4ec4ec4ec4ec4ec5 +
                 ((long)(result->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                        .super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl
                        .super__Vector_impl_data._M_finish -
                  (long)(result->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                        .super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl
                        .super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
        if (uVar10 != 0) {
          sVar8 = 0;
          do {
            pvVar7 = vector<duckdb::Vector,_true>::operator[](&result->data,sVar8);
            Vector::SetVectorType(pvVar7,CONSTANT_VECTOR);
            pvVar7 = vector<duckdb::Vector,_true>::operator[](&result->data,sVar8);
            ConstantVector::SetNull(pvVar7,true);
            sVar8 = sVar8 + 1;
          } while (uVar10 != sVar8);
        }
        if (uVar10 < (ulong)(((long)(result->data).
                                    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(result->data).
                                    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            0x4ec4ec4ec4ec4ec5)) {
          sVar8 = 0;
          do {
            pvVar7 = vector<duckdb::Vector,_true>::operator[](&result->data,uVar10 + sVar8);
            other = vector<duckdb::Vector,_true>::operator[]
                              ((vector<duckdb::Vector,_true> *)lstate,sVar8);
            Vector::Slice(pvVar7,other,&lstate->match_sel,count);
            lVar1 = uVar10 + sVar8;
            sVar8 = sVar8 + 1;
          } while (lVar1 + 1U <
                   (ulong)(((long)(result->data).
                                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(result->data).
                                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          0x4ec4ec4ec4ec4ec5));
        }
        result->count = count;
        if (count != 0) {
          return;
        }
      }
      bVar6 = ColumnDataCollection::Scan
                        (gstate->data,&gstate->global_scan,&lstate->local_scan,&lstate->scan_chunk);
    } while (bVar6);
  }
  return;
}

Assistant:

void OuterJoinMarker::Scan(OuterJoinGlobalScanState &gstate, OuterJoinLocalScanState &lstate, DataChunk &result) {
	D_ASSERT(gstate.data);
	// fill in NULL values for the LHS
	while (gstate.data->Scan(gstate.global_scan, lstate.local_scan, lstate.scan_chunk)) {
		idx_t result_count = 0;
		// figure out which tuples didn't find a match in the RHS
		for (idx_t i = 0; i < lstate.scan_chunk.size(); i++) {
			if (!found_match[lstate.local_scan.current_row_index + i]) {
				lstate.match_sel.set_index(result_count++, i);
			}
		}
		if (result_count > 0) {
			// if there were any tuples that didn't find a match, output them
			idx_t left_column_count = result.ColumnCount() - lstate.scan_chunk.ColumnCount();
			for (idx_t i = 0; i < left_column_count; i++) {
				result.data[i].SetVectorType(VectorType::CONSTANT_VECTOR);
				ConstantVector::SetNull(result.data[i], true);
			}
			for (idx_t col_idx = left_column_count; col_idx < result.ColumnCount(); col_idx++) {
				result.data[col_idx].Slice(lstate.scan_chunk.data[col_idx - left_column_count], lstate.match_sel,
				                           result_count);
			}
			result.SetCardinality(result_count);
			return;
		}
	}
}